

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_420_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar3 = _DAT_004c1110;
  auVar2 = _DAT_004c1100;
  auVar1 = _DAT_0046eb50;
  puVar4 = pred_buf_q3 + (ulong)(height * 2 & 0xfffffffc) * 8;
  do {
    if (width == 8) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)*(undefined1 (*) [16])input;
      auVar5 = pmaddubsw(auVar5,auVar2);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(*(undefined1 (*) [16])input + input_stride);
      auVar6 = pmaddubsw(auVar6,auVar2);
      *(ulong *)pred_buf_q3 =
           CONCAT26(auVar6._6_2_ + auVar5._6_2_,
                    CONCAT24(auVar6._4_2_ + auVar5._4_2_,
                             CONCAT22(auVar6._2_2_ + auVar5._2_2_,auVar6._0_2_ + auVar5._0_2_)));
    }
    else if (width == 4) {
      auVar5 = pmaddubsw(ZEXT416(*(uint *)*(undefined1 (*) [16])input),auVar3);
      auVar6 = pmaddubsw(ZEXT416(*(uint *)(*(undefined1 (*) [16])input + input_stride)),auVar3);
      *(uint *)pred_buf_q3 = CONCAT22(auVar6._2_2_ + auVar5._2_2_,auVar6._0_2_ + auVar5._0_2_);
    }
    else {
      auVar5 = pmaddubsw(*(undefined1 (*) [16])input,auVar1);
      auVar6 = pmaddubsw(*(undefined1 (*) [16])(*(undefined1 (*) [16])input + input_stride),auVar1);
      *pred_buf_q3 = auVar6._0_2_ + auVar5._0_2_;
      pred_buf_q3[1] = auVar6._2_2_ + auVar5._2_2_;
      pred_buf_q3[2] = auVar6._4_2_ + auVar5._4_2_;
      pred_buf_q3[3] = auVar6._6_2_ + auVar5._6_2_;
      pred_buf_q3[4] = auVar6._8_2_ + auVar5._8_2_;
      pred_buf_q3[5] = auVar6._10_2_ + auVar5._10_2_;
      pred_buf_q3[6] = auVar6._12_2_ + auVar5._12_2_;
      pred_buf_q3[7] = auVar6._14_2_ + auVar5._14_2_;
      if (width == 0x20) {
        auVar5 = pmaddubsw(*(undefined1 (*) [16])((long)input + 0x10),auVar1);
        auVar6 = pmaddubsw(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)input + 0x10) + input_stride),auVar1);
        pred_buf_q3[8] = auVar6._0_2_ + auVar5._0_2_;
        pred_buf_q3[9] = auVar6._2_2_ + auVar5._2_2_;
        pred_buf_q3[10] = auVar6._4_2_ + auVar5._4_2_;
        pred_buf_q3[0xb] = auVar6._6_2_ + auVar5._6_2_;
        pred_buf_q3[0xc] = auVar6._8_2_ + auVar5._8_2_;
        pred_buf_q3[0xd] = auVar6._10_2_ + auVar5._10_2_;
        pred_buf_q3[0xe] = auVar6._12_2_ + auVar5._12_2_;
        pred_buf_q3[0xf] = auVar6._14_2_ + auVar5._14_2_;
      }
    }
    input = *(undefined1 (*) [16])input + input_stride * 2;
    pred_buf_q3 = pred_buf_q3 + 0x20;
  } while (pred_buf_q3 < puVar4);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i twos = _mm_set1_epi8(2);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + (height >> 1) * CFL_BUF_LINE_I128;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadh_epi32((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storel_epi64(pred_buf_m128i, sum);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeu_si128(pred_buf_m128i, sum);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        top_1 = _mm_maddubs_epi16(top_1, twos);
        bot_1 = _mm_maddubs_epi16(bot_1, twos);
        __m128i sum_1 = _mm_add_epi16(top_1, bot_1);
        _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}